

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_send_body(http_s *r,void *data,uintptr_t length)

{
  int iVar1;
  
  iVar1 = -1;
  if ((r != (http_s *)0x0) && (((r->method != 0 || (r->status_str != 0)) || (r->status == 0)))) {
    if (data != (void *)0x0 && length != 0) {
      add_content_length(r,length);
      add_date(r);
      iVar1 = (**(r->private_data).vtbl)(r,data,length);
      return iVar1;
    }
    http_finish(r);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int http_send_body(http_s *r, void *data, uintptr_t length) {
  if (HTTP_INVALID_HANDLE(r))
    return -1;
  if (!length || !data) {
    http_finish(r);
    return 0;
  }
  add_content_length(r, length);
  // add_content_type(r);
  add_date(r);
  return ((http_vtable_s *)r->private_data.vtbl)
      ->http_send_body(r, data, length);
}